

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::OptIsInvariant
          (GlobOpt *this,Opnd *src,BasicBlock *block,Loop *loop,Value *srcVal,bool isNotTypeSpecConv
          ,bool allowNonPrimitives)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  PropertySymOpnd *pPVar5;
  Sym *sym;
  
  bVar2 = Loop::CanHoistInvariants(loop);
  if (bVar2) {
    OVar3 = IR::Opnd::GetKind(src);
    bVar2 = true;
    switch(OVar3) {
    case OpndKindIntConst:
    case OpndKindFloatConst:
    case OpndKindAddr:
      goto switchD_00444f2d_caseD_1;
    case OpndKindHelperCall:
      OVar3 = IR::Opnd::GetKind(src);
      if (OVar3 != OpndKindHelperCall) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x16a,"(this->IsHelperCallOpnd())","Bad call to AsHelperCallOpnd()");
        if (!bVar2) {
LAB_004451a2:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      bVar2 = HelperMethodAttributes::IsInVariant(*(JnHelperMethod *)&src[1]._vptr_Opnd);
      return bVar2;
    case OpndKindSym:
      OVar3 = IR::Opnd::GetKind(src);
      if (OVar3 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar2) goto LAB_004451a2;
        *puVar4 = 0;
      }
      sym = (Sym *)src[1]._vptr_Opnd;
      OVar3 = IR::Opnd::GetKind(src);
      if (OVar3 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar2) goto LAB_004451a2;
        *puVar4 = 0;
      }
      bVar2 = IR::SymOpnd::IsPropertySymOpnd((SymOpnd *)src);
      if (!bVar2) goto LAB_0044517e;
      OVar3 = IR::Opnd::GetKind(src);
      if (OVar3 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar2) goto LAB_004451a2;
        *puVar4 = 0;
      }
      pPVar5 = IR::Opnd::AsPropertySymOpnd(src);
      if (((pPVar5->field_12).field_0.field_5.typeCheckSeqFlags & 8) == 0) goto LAB_0044517e;
      break;
    case OpndKindReg:
      OVar3 = IR::Opnd::GetKind(src);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar2) goto LAB_004451a2;
        *puVar4 = 0;
      }
      sym = (Sym *)src[1]._vptr_Opnd;
LAB_0044517e:
      bVar2 = OptIsInvariant(this,sym,block,loop,srcVal,isNotTypeSpecConv,allowNonPrimitives,
                             (Value **)0x0);
      return bVar2;
    }
  }
  bVar2 = false;
switchD_00444f2d_caseD_1:
  return bVar2;
}

Assistant:

bool
GlobOpt::OptIsInvariant(IR::Opnd *src, BasicBlock *block, Loop *loop, Value *srcVal, bool isNotTypeSpecConv, bool allowNonPrimitives)
{
    if(!loop->CanHoistInvariants())
    {
        return false;
    }

    Sym *sym;

    switch(src->GetKind())
    {
    case IR::OpndKindAddr:
    case IR::OpndKindFloatConst:
    case IR::OpndKindIntConst:
        return true;

    case IR::OpndKindReg:
        sym = src->AsRegOpnd()->m_sym;
        break;

    case IR::OpndKindSym:
        sym = src->AsSymOpnd()->m_sym;
        if (src->AsSymOpnd()->IsPropertySymOpnd())
        {
            if (src->AsSymOpnd()->AsPropertySymOpnd()->IsTypeChecked())
            {
                // We do not handle hoisting these yet.  We might be hoisting this across the instr with the type check protecting this one.
                // And somehow, the dead-store pass now removes the type check on that instr later on...
                // For CheckFixedFld, there is no benefit hoisting these if they don't have a type check as they won't generate code.
                return false;
            }
        }

        break;

    case IR::OpndKindHelperCall:
        // Helper calls, like the private slot getter, can be invariant.
        // Consider moving more math builtin to invariant?
        return HelperMethodAttributes::IsInVariant(src->AsHelperCallOpnd()->m_fnHelper);

    default:
        return false;
    }
    return OptIsInvariant(sym, block, loop, srcVal, isNotTypeSpecConv, allowNonPrimitives);
}